

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

archive * archive_read_disk_new(void)

{
  archive *paVar1;
  
  paVar1 = (archive *)calloc(1,0x100);
  if (paVar1 != (archive *)0x0) {
    paVar1->magic = 0xbadb0c5;
    paVar1->state = 1;
    if (archive_read_disk_vtable_inited == '\0') {
      archive_read_disk_vtable_av._8_8_ = _archive_read_free;
      archive_read_disk_vtable_av._0_8_ = _archive_read_close;
      archive_read_disk_vtable_av._64_8_ = _archive_read_data_block;
      archive_read_disk_vtable_av._56_8_ = _archive_read_next_header2;
      archive_read_disk_vtable_inited = '\x01';
    }
    paVar1->vtable = (archive_vtable_conflict *)archive_read_disk_vtable_av;
    paVar1[1].error_string.buffer_length = (size_t)trivial_lookup_uname;
    paVar1[1].error = (char *)trivial_lookup_gname;
    paVar1[1].file_count = 1;
    paVar1[1].archive_error_number = 1;
    *(code **)&paVar1[1].archive_format = open_on_current_dir;
    paVar1[1].archive_format_name = (char *)tree_current_dir_fd;
    *(code **)&paVar1[1].compression_code = tree_enter_working_dir;
  }
  return paVar1;
}

Assistant:

struct archive *
archive_read_disk_new(void)
{
	struct archive_read_disk *a;

	a = (struct archive_read_disk *)calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_READ_DISK_MAGIC;
	a->archive.state = ARCHIVE_STATE_NEW;
	a->archive.vtable = archive_read_disk_vtable();
	a->lookup_uname = trivial_lookup_uname;
	a->lookup_gname = trivial_lookup_gname;
	a->enable_copyfile = 1;
	a->traverse_mount_points = 1;
	a->open_on_current_dir = open_on_current_dir;
	a->tree_current_dir_fd = tree_current_dir_fd;
	a->tree_enter_working_dir = tree_enter_working_dir;
	return (&a->archive);
}